

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.c
# Opt level: O0

SNode * new_SNode(Parser *p,D_State *state,d_loc_t *loc,D_Scope *sc)

{
  int iVar1;
  uint32 uVar2;
  SNode *local_30;
  SNode *sn;
  D_Scope *sc_local;
  d_loc_t *loc_local;
  D_State *state_local;
  Parser *p_local;
  
  local_30 = p->free_snodes;
  if (local_30 == (SNode *)0x0) {
    local_30 = (SNode *)malloc(0x78);
  }
  else {
    p->free_snodes = local_30->all_next;
  }
  *(uint *)&local_30->field_0x24 = *(uint *)&local_30->field_0x24 & 0x80000000;
  *(uint *)&local_30->field_0x24 = *(uint *)&local_30->field_0x24 & 0x7fffffff;
  (local_30->zns).n = 0;
  (local_30->zns).v = (ZNode **)0x0;
  local_30->refcount = 0;
  local_30->all_next = (SNode *)0x0;
  p->states = p->states + 1;
  local_30->state = state;
  local_30->initial_scope = sc;
  local_30->last_pn = (PNode *)0x0;
  (local_30->loc).s = loc->s;
  (local_30->loc).pathname = loc->pathname;
  (local_30->loc).ws = loc->ws;
  iVar1 = loc->line;
  (local_30->loc).col = loc->col;
  (local_30->loc).line = iVar1;
  insert_SNode(p,local_30);
  if (local_30->state->accept != '\0') {
    if (p->accept == (SNode *)0x0) {
      local_30->refcount = local_30->refcount + 1;
      p->accept = local_30;
    }
    else if ((p->accept->loc).s < (local_30->loc).s) {
      local_30->refcount = local_30->refcount + 1;
      uVar2 = p->accept->refcount - 1;
      p->accept->refcount = uVar2;
      if (uVar2 == 0) {
        free_SNode(p,p->accept);
      }
      p->accept = local_30;
    }
  }
  return local_30;
}

Assistant:

static SNode *new_SNode(Parser *p, D_State *state, d_loc_t *loc, D_Scope *sc) {
  SNode *sn = p->free_snodes;
  if (!sn)
    sn = MALLOC(sizeof *sn);
  else
    p->free_snodes = sn->all_next;
  sn->depth = 0;
  sn->in_error_recovery_queue = 0;
  vec_clear(&sn->zns);
#ifndef USE_GC
  sn->refcount = 0;
#endif
  sn->all_next = 0;
  p->states++;
  sn->state = state;
  sn->initial_scope = sc;
  sn->last_pn = NULL;
  sn->loc = *loc;
  insert_SNode(p, sn);
  if (sn->state->accept) {
    if (!p->accept) {
      ref_sn(sn);
      p->accept = sn;
    } else if (sn->loc.s > p->accept->loc.s) {
      ref_sn(sn);
      unref_sn(p, p->accept);
      p->accept = sn;
    }
  }
  return sn;
}